

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O3

dgEdge * __thiscall dgMeshEffect::ConectVertex(dgMeshEffect *this,dgEdge *e0,dgEdge *e1)

{
  dgEdge *pdVar1;
  dgEdge *pdVar2;
  dgEdge *pdVar3;
  
  pdVar2 = dgPolyhedra::AddHalfEdge
                     (&this->super_dgPolyhedra,e1->m_incidentVertex,e0->m_incidentVertex);
  pdVar3 = dgPolyhedra::AddHalfEdge
                     (&this->super_dgPolyhedra,e0->m_incidentVertex,e1->m_incidentVertex);
  if ((pdVar2 != (dgEdge *)0x0) == (pdVar3 != (dgEdge *)0x0)) {
    if (pdVar2 != (dgEdge *)0x0) {
      pdVar2->m_twin = pdVar3;
      pdVar3->m_twin = pdVar2;
      pdVar2->m_incidentFace = e0->m_incidentFace;
      pdVar3->m_incidentFace = e1->m_incidentFace;
      pdVar2->m_userData = e1->m_userData;
      pdVar3->m_userData = e0->m_userData;
      pdVar2->m_next = e0;
      pdVar2->m_prev = e1->m_prev;
      pdVar3->m_next = e1;
      pdVar1 = e0->m_prev;
      pdVar3->m_prev = pdVar1;
      pdVar1->m_next = pdVar3;
      e0->m_prev = pdVar2;
      e1->m_prev->m_next = pdVar2;
      e1->m_prev = pdVar3;
    }
    return pdVar2;
  }
  __assert_fail("(edge && twin) || !(edge || twin)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMeshEffect.cpp"
                ,0x5b7,"dgEdge *dgMeshEffect::ConectVertex(dgEdge *const, dgEdge *const)");
}

Assistant:

dgEdge* dgMeshEffect::ConectVertex (dgEdge* const e0, dgEdge* const e1)
{
	dgEdge* const edge = AddHalfEdge(e1->m_incidentVertex, e0->m_incidentVertex);
	dgEdge* const twin = AddHalfEdge(e0->m_incidentVertex, e1->m_incidentVertex);
	HACD_ASSERT ((edge && twin) || !(edge || twin));
	if (edge) {
		edge->m_twin = twin;
		twin->m_twin = edge;

		edge->m_incidentFace = e0->m_incidentFace;
		twin->m_incidentFace = e1->m_incidentFace;

		edge->m_userData = e1->m_userData;
		twin->m_userData = e0->m_userData;

		edge->m_next = e0;
		edge->m_prev = e1->m_prev;

		twin->m_next = e1;
		twin->m_prev = e0->m_prev;

		e0->m_prev->m_next = twin;
		e0->m_prev = edge;

		e1->m_prev->m_next = edge;
		e1->m_prev = twin;
	}

	return edge;
}